

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void printsub(Curl_easy *data,int direction,uchar *pointer,size_t length)

{
  uchar uVar1;
  uint uVar2;
  char *pcVar3;
  uint local_2c;
  int j;
  uint i;
  size_t length_local;
  uchar *pointer_local;
  int direction_local;
  Curl_easy *data_local;
  
  local_2c = 0;
  if (((data->set).verbose & 1U) != 0) {
    _j = length;
    if (direction != 0) {
      pcVar3 = "SENT";
      if (direction == 0x3c) {
        pcVar3 = "RCVD";
      }
      Curl_infof(data,"%s IAC SB ",pcVar3);
      if (2 < length) {
        local_2c = (uint)pointer[length - 2];
        uVar2 = (uint)pointer[length - 1];
        if ((local_2c != 0xff) || (uVar2 != 0xf0)) {
          Curl_infof(data,"(terminated by ");
          if (local_2c < 0x28) {
            Curl_infof(data,"%s ",telnetoptions[local_2c]);
          }
          else if ((local_2c < 0xec) || (0xff < local_2c)) {
            Curl_infof(data,"%u ",(ulong)local_2c);
          }
          else {
            Curl_infof(data,"%s ",telnetcmds[local_2c - 0xec]);
          }
          if (uVar2 < 0x28) {
            Curl_infof(data,"%s",telnetoptions[(int)uVar2]);
          }
          else if ((uVar2 < 0xec) || (0xff < uVar2)) {
            Curl_infof(data,"%d",(ulong)uVar2);
          }
          else {
            Curl_infof(data,"%s",telnetcmds[(int)(uVar2 - 0xec)]);
          }
          Curl_infof(data,", not IAC SE!) ");
        }
      }
      _j = length - 2;
    }
    if (_j == 0) {
      Curl_infof(data,"(Empty suboption?)");
    }
    else {
      if (*pointer < 0x28) {
        uVar1 = *pointer;
        if ((((uVar1 == '\x18') || (uVar1 == '\x1f')) || (uVar1 == '#')) || (uVar1 == '\'')) {
          Curl_infof(data,"%s",telnetoptions[*pointer]);
        }
        else {
          Curl_infof(data,"%s (unsupported)",telnetoptions[*pointer]);
        }
      }
      else {
        Curl_infof(data,"%d (unknown)",(ulong)pointer[local_2c]);
      }
      if (*pointer == '\x1f') {
        if (4 < _j) {
          Curl_infof(data,"Width: %hu ; Height: %hu",(ulong)CONCAT11(pointer[1],pointer[2]),
                     (ulong)CONCAT11(pointer[3],pointer[4]));
        }
      }
      else {
        switch(pointer[1]) {
        case '\0':
          Curl_infof(data," IS");
          break;
        case '\x01':
          Curl_infof(data," SEND");
          break;
        case '\x02':
          Curl_infof(data," INFO/REPLY");
          break;
        case '\x03':
          Curl_infof(data," NAME");
        }
        uVar1 = *pointer;
        if ((uVar1 == '\x18') || (uVar1 == '#')) {
          pointer[_j] = '\0';
          Curl_infof(data," \"%s\"",pointer + 2);
        }
        else if (uVar1 == '\'') {
          if (pointer[1] == '\0') {
            Curl_infof(data," ");
            for (local_2c = 3; local_2c < _j; local_2c = local_2c + 1) {
              if (pointer[local_2c] == '\0') {
                Curl_infof(data,", ");
              }
              else if (pointer[local_2c] == '\x01') {
                Curl_infof(data," = ");
              }
              else {
                Curl_infof(data,"%c",(ulong)pointer[local_2c]);
              }
            }
          }
        }
        else {
          for (local_2c = 2; local_2c < _j; local_2c = local_2c + 1) {
            Curl_infof(data," %.2x",(ulong)pointer[local_2c]);
          }
        }
      }
      if (direction != 0) {
        Curl_infof(data,"\n");
      }
    }
  }
  return;
}

Assistant:

static void printsub(struct Curl_easy *data,
                     int direction,             /* '<' or '>' */
                     unsigned char *pointer,    /* where suboption data is */
                     size_t length)             /* length of suboption data */
{
  unsigned int i = 0;

  if(data->set.verbose) {
    if(direction) {
      infof(data, "%s IAC SB ", (direction == '<')? "RCVD":"SENT");
      if(length >= 3) {
        int j;

        i = pointer[length-2];
        j = pointer[length-1];

        if(i != CURL_IAC || j != CURL_SE) {
          infof(data, "(terminated by ");
          if(CURL_TELOPT_OK(i))
            infof(data, "%s ", CURL_TELOPT(i));
          else if(CURL_TELCMD_OK(i))
            infof(data, "%s ", CURL_TELCMD(i));
          else
            infof(data, "%u ", i);
          if(CURL_TELOPT_OK(j))
            infof(data, "%s", CURL_TELOPT(j));
          else if(CURL_TELCMD_OK(j))
            infof(data, "%s", CURL_TELCMD(j));
          else
            infof(data, "%d", j);
          infof(data, ", not IAC SE!) ");
        }
      }
      length -= 2;
    }
    if(length < 1) {
      infof(data, "(Empty suboption?)");
      return;
    }

    if(CURL_TELOPT_OK(pointer[0])) {
      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
      case CURL_TELOPT_NEW_ENVIRON:
      case CURL_TELOPT_NAWS:
        infof(data, "%s", CURL_TELOPT(pointer[0]));
        break;
      default:
        infof(data, "%s (unsupported)", CURL_TELOPT(pointer[0]));
        break;
      }
    }
    else
      infof(data, "%d (unknown)", pointer[i]);

    switch(pointer[0]) {
    case CURL_TELOPT_NAWS:
      if(length > 4)
        infof(data, "Width: %hu ; Height: %hu", (pointer[1]<<8) | pointer[2],
              (pointer[3]<<8) | pointer[4]);
      break;
    default:
      switch(pointer[1]) {
      case CURL_TELQUAL_IS:
        infof(data, " IS");
        break;
      case CURL_TELQUAL_SEND:
        infof(data, " SEND");
        break;
      case CURL_TELQUAL_INFO:
        infof(data, " INFO/REPLY");
        break;
      case CURL_TELQUAL_NAME:
        infof(data, " NAME");
        break;
      }

      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
        pointer[length] = 0;
        infof(data, " \"%s\"", &pointer[2]);
        break;
      case CURL_TELOPT_NEW_ENVIRON:
        if(pointer[1] == CURL_TELQUAL_IS) {
          infof(data, " ");
          for(i = 3; i < length; i++) {
            switch(pointer[i]) {
            case CURL_NEW_ENV_VAR:
              infof(data, ", ");
              break;
            case CURL_NEW_ENV_VALUE:
              infof(data, " = ");
              break;
            default:
              infof(data, "%c", pointer[i]);
              break;
            }
          }
        }
        break;
      default:
        for(i = 2; i < length; i++)
          infof(data, " %.2x", pointer[i]);
        break;
      }
    }
    if(direction)
      infof(data, "\n");
  }
}